

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

Var __thiscall Js::SourceTextModuleRecord::ModuleEvaluation(SourceTextModuleRecord *this)

{
  Type *pTVar1;
  Var aValue;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  WriteBarrierPtr<Js::SourceTextModuleRecord> *pWVar4;
  code *pcVar5;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  bool bVar8;
  int iVar9;
  JavascriptString *pJVar10;
  undefined4 extraout_var;
  undefined4 *puVar12;
  Type *ppIVar13;
  long lVar14;
  long lVar15;
  RecyclableObject *pRVar16;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar17;
  char16_t *local_50;
  Iterator local_48;
  SourceTextModuleRecord *local_38;
  SourceTextModuleRecord *childModuleRecord;
  char16_t *pcVar11;
  
  aValue = (this->normalizedSpecifier).ptr;
  if (aValue == (Var)0x0) {
    pcVar11 = L"module";
  }
  else {
    pJVar10 = VarTo<Js::JavascriptString>(aValue);
    iVar9 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar10);
    pcVar11 = (char16_t *)CONCAT44(extraout_var,iVar9);
  }
  pRVar16 = (RecyclableObject *)0x0;
  Output::TraceWithFlush(ModulePhase,L"ModuleEvaluation(%s)\n",pcVar11);
  if ((this->super_ModuleRecordBase).wasEvaluated == false) {
    if ((this->evaluating == false) &&
       (((((this->scriptContext).ptr)->config).threadConfig)->m_ES6Module == true)) {
      if ((this->wasPrepassed != false) || (bVar8 = ModuleEvaluationPrepass(this), bVar8)) {
        if ((this->errorObject).ptr != (void *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                      ,0x431,"(this->errorObject == nullptr)",
                                      "this->errorObject == nullptr");
          if (!bVar8) {
LAB_00b06e12:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar12 = 0;
        }
        this->evaluating = true;
        pSVar17 = (this->requestedModuleList).ptr;
        if (pSVar17 != (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          pSVar6 = pSVar17;
          pSVar7 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)
                   (pSVar17->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
          while (pSVar7 != pSVar17) {
            pSVar2 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)
                     (pSVar7->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
            (pSVar7->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
            super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar6;
            pSVar6 = pSVar7;
            pSVar7 = pSVar2;
          }
          (pSVar7->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar6;
          pSVar17 = (this->requestedModuleList).ptr;
          local_48.list = &pSVar17->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>;
          local_48.current = (NodeBase *)pSVar17;
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          do {
            if (pSVar17 == (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar12 = 1;
              bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                          ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar8) goto LAB_00b06e12;
              *puVar12 = 0;
              pSVar17 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
            }
            pSVar17 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)
                      (pSVar17->super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>).
                      super_SListNodeBase<Memory::ArenaAllocator>.next;
            if (pSVar17 == (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_48.list)
            break;
            local_48.current = (NodeBase *)pSVar17;
            ppIVar13 = SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                 (&local_48);
            local_38 = (SourceTextModuleRecord *)0x0;
            local_50 = (char16_t *)&(*ppIVar13)->field_0x22;
            bVar8 = JsUtil::
                    BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    ::TryGetValue<char16_t_const*>
                              ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                *)(this->childrenModuleSet).ptr,&local_50,&local_38);
            if (!bVar8) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar12 = 1;
              bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                          ,0x439,
                                          "(childrenModuleSet->TryGetValue(specifier->Psz(), &childModuleRecord))"
                                          ,
                                          "childrenModuleSet->TryGetValue(specifier->Psz(), &childModuleRecord)"
                                         );
              if (!bVar8) goto LAB_00b06e12;
              *puVar12 = 0;
            }
            (*(local_38->super_ModuleRecordBase).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xc])();
            pSVar17 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current;
            if ((local_38->errorObject).ptr != (void *)0x0) {
              ReleaseParserResourcesForHierarchy(this);
              JavascriptExceptionOperators::Throw
                        ((local_38->errorObject).ptr,(this->scriptContext).ptr);
            }
          } while( true );
        }
        if (this->awaitedModules == 0) {
          FinishModuleEvaluation(this,true);
        }
        else {
          pLVar3 = (this->parentModuleList).ptr;
          if ((pLVar3 != (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)0x0) &&
             (lVar14 = (long)(pLVar3->
                             super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                             ).count, 0 < lVar14)) {
            pWVar4 = (pLVar3->
                     super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                     ).buffer.ptr;
            lVar15 = 0;
            do {
              pTVar1 = &(pWVar4[lVar15].ptr)->awaitedModules;
              *pTVar1 = *pTVar1 + 1;
              lVar15 = lVar15 + 1;
            } while (lVar14 != lVar15);
          }
        }
      }
      pRVar16 = (((((this->scriptContext).ptr)->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      pRVar16 = (RecyclableObject *)0x0;
    }
  }
  return pRVar16;
}

Assistant:

Var SourceTextModuleRecord::ModuleEvaluation()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ModuleEvaluation(%s)\n"), this->GetSpecifierSz());

        if (WasEvaluated() || IsEvaluating() || !scriptContext->GetConfig()->IsES6ModuleEnabled())
        {
            return nullptr;
        }

        try
        {
            if (!WasEvaluationPrepassed())
            {
                if (!ModuleEvaluationPrepass())
                {
                    return scriptContext->GetLibrary()->GetUndefined();
                }
            }

            Assert(this->errorObject == nullptr);
            SetEvaluating(true);
            
            if (requestedModuleList != nullptr)
            {
                requestedModuleList->Reverse();
                requestedModuleList->Map([&](IdentPtr specifier) {
                    SourceTextModuleRecord* childModuleRecord = nullptr;
                    AssertOrFailFast(childrenModuleSet->TryGetValue(specifier->Psz(), &childModuleRecord));

                    childModuleRecord->ModuleEvaluation();
                    // if child module was evaluated before and threw need to re-throw now
                    // if child module has been dynamically imported and has exception need to throw
                    if (childModuleRecord->GetErrorObject() != nullptr)
                    {
                        this->ReleaseParserResourcesForHierarchy();

                        JavascriptExceptionOperators::Throw(childModuleRecord->GetErrorObject(), this->scriptContext);
                    }
                });
            }
            if (awaitedModules == 0)
            {
                FinishModuleEvaluation(true);
            }
            else
            {
                if (this->parentModuleList != nullptr)
                {
                    parentModuleList->Map([=](uint i, SourceTextModuleRecord* parentModule)
                    {
                        parentModule->IncrementAwaited();
                    });
                }
            }
        }
        catch (const Js::JavascriptException &err)
        {
            if (!WasEvaluated())
            {
                SetWasEvaluated();
            }
            SetEvaluating(false);
            JavascriptExceptionObject *exception = err.GetAndClear();
            Var errorObject = exception->GetThrownObject(scriptContext);
            AssertOrFailFastMsg(errorObject != nullptr, "ModuleEvaluation: null error object thrown from root function");
            this->errorObject = errorObject;
            if (this->promise != nullptr)
            {
                ResolveOrRejectDynamicImportPromise(false, errorObject, scriptContext, this, false);
            }
            if (isRootModule && !ReportModuleCompletion(this, errorObject))
            {
                JavascriptExceptionOperators::DoThrowCheckClone(exception, scriptContext);
            }
        }

        return scriptContext->GetLibrary()->GetUndefined();
    }